

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O1

void k053260_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  long *plVar1;
  char cVar2;
  long lVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int local_38;
  
  if (((*(byte *)((long)param + 0x25) & 2) == 0) || (*(long *)((long)param + 200) == 0)) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
    return;
  }
  if (samples != 0) {
    lVar3 = *(long *)((long)param + 0xd8);
    uVar7 = *(ulong *)((long)param + 0xe0);
    pDVar4 = *outputs;
    pDVar5 = outputs[1];
    uVar8 = 0;
    do {
      uVar6 = uVar7 + lVar3;
      uVar7 = uVar6 & 0xffffffff;
      *(ulong *)((long)param + 0xe0) = uVar7;
      lVar9 = 0;
      iVar16 = 0;
      iVar15 = 0;
      do {
        if ((*(char *)((long)param + lVar9 * 0x28 + 0x3f) != '\0') &&
           (plVar1 = (long *)((long)param + lVar9 * 0x28 + 0x28),
           *(char *)((long)plVar1 + 0x25) == '\0')) {
          local_38 = (int)(uVar6 >> 0x20);
          uVar14 = *(int *)((long)plVar1 + 0x14) + local_38;
          if ((short)*(int *)((long)plVar1 + 0x14) == -1) {
            uVar14 = 0x1000;
          }
          *(short *)((long)plVar1 + 0x14) = (short)uVar14;
          if (0xfff < (uVar14 & 0xffff)) {
            cVar2 = *(char *)((long)plVar1 + 0x23);
            uVar13 = *(uint *)(plVar1 + 1);
            iVar12 = *(ushort *)((long)plVar1 + 0x1e) - 0x1000;
            do {
              *(short *)((long)plVar1 + 0x14) = (short)iVar12 + (short)uVar14;
              uVar13 = uVar13 + 1;
              *(uint *)(plVar1 + 1) = uVar13;
              uVar11 = uVar13 >> (cVar2 != '\0');
              if ((int)(uint)*(ushort *)((long)plVar1 + 0x1c) < (int)uVar11) {
                if (*(char *)((long)plVar1 + 0x22) == '\0') {
                  *(undefined1 *)((long)plVar1 + 0x17) = 0;
                  goto LAB_00163a42;
                }
                *(undefined1 *)((long)plVar1 + 0x16) = 0;
                *(undefined4 *)(plVar1 + 1) = 0;
                uVar13 = 0;
                uVar11 = 0 >> (cVar2 != '\0');
              }
              uVar17 = -uVar11;
              if (*(char *)((long)plVar1 + 0x24) == '\0') {
                uVar17 = uVar11;
              }
              bVar10 = *(byte *)(*(long *)(*plVar1 + 200) +
                                (ulong)(uVar17 + (int)plVar1[3] & *(uint *)(*plVar1 + 0xd4)));
              if (cVar2 != '\0') {
                bVar10 = *(char *)((long)plVar1 + 0x16) +
                         KDSC_play_kadpcm_table[bVar10 >> ((char)uVar13 * '\x04' & 4U) & 0xf];
              }
              *(byte *)((long)plVar1 + 0x16) = bVar10;
              uVar14 = uVar14 + iVar12;
            } while (0xfff < (uVar14 & 0xffff));
          }
          iVar16 = iVar16 + (*(int *)((long)plVar1 + 0xc) * (int)*(char *)((long)plVar1 + 0x16) >>
                            0xf);
          iVar15 = iVar15 + ((int)*(char *)((long)plVar1 + 0x16) * (int)plVar1[2] >> 0xf);
        }
LAB_00163a42:
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      pDVar4[uVar8] = iVar16;
      pDVar5[uVar8] = iVar15;
      uVar8 = uVar8 + 1;
    } while (uVar8 != samples);
  }
  return;
}

Assistant:

static void k053260_update(void* param, UINT32 samples, DEV_SMPL **outputs)
{
	k053260_state *info = (k053260_state *)param;

	if ((info->mode & 2) && info->rom != NULL)
	{
		UINT32 i, j;

		for (j = 0; j < samples; j++)
		{
			DEV_SMPL buffer[2] = {0, 0};
			UINT16 cycles;

			RC_STEP(&info->cycleCntr);
			cycles = (UINT16)RC_GET_VAL(&info->cycleCntr);
			RC_MASK(&info->cycleCntr);

			for ( i = 0; i < 4; i++ )
			{
				if (info->voice[i].playing && !info->voice[i].Muted)
					KDSC_play(&info->voice[i], buffer, cycles);
			}

			outputs[0][j] = buffer[0];
			outputs[1][j] = buffer[1];
		}
	}
	else
	{
		memset( outputs[0], 0, samples * sizeof(*outputs[0]));
		memset( outputs[1], 0, samples * sizeof(*outputs[1]));
	}
}